

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O2

int noargs(void)

{
  program_t *value;
  value_t *val;
  vm_t vm;
  
  deci::vm_t::vm_t(&vm);
  value = deci::program_t::Create(commands,10);
  val = deci::vm_t::Run(&vm,(value_t *)value);
  deci::stack_t::Push(&vm.dataStack,val);
  deci::stack_t::Print(&vm.dataStack,(ostream *)&std::cout);
  (*val->_vptr_value_t[3])(val);
  (*(value->super_function_t).super_value_t._vptr_value_t[3])(value);
  deci::vm_t::~vm_t(&vm);
  return 0;
}

Assistant:

int noargs() {
  deci::value_t* tmp;
  deci::vm_t vm;
  deci::program_t* prog = deci::program_t::Create(commands, deci::countof(commands));

  vm.GlobalStack().Push(*(tmp = vm.Run(*prog)));
  vm.GlobalStack().Print(std::cout);

  tmp->Delete();
  prog->Delete();
  return 0;
}